

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

int add_pending_io(SOCKET_IO_INSTANCE *socket_io_instance,uchar *buffer,size_t size,
                  ON_SEND_COMPLETE on_send_complete,void *callback_context)

{
  long *item;
  void *pvVar1;
  LOGGER_LOG p_Var2;
  LIST_ITEM_HANDLE pLVar3;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  PENDING_SOCKET_IO *pending_socket_io;
  int result;
  void *callback_context_local;
  ON_SEND_COMPLETE on_send_complete_local;
  size_t size_local;
  uchar *buffer_local;
  SOCKET_IO_INSTANCE *socket_io_instance_local;
  
  item = (long *)malloc(0x28);
  if (item == (long *)0x0) {
    pending_socket_io._4_4_ = 0xe3;
  }
  else {
    pvVar1 = malloc(size);
    *item = (long)pvVar1;
    if (*item == 0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/socketio_berkeley.c"
                  ,"add_pending_io",0xea,1,"Allocation Failure: Unable to allocate pending list.");
      }
      free(item);
      pending_socket_io._4_4_ = 0xec;
    }
    else {
      item[1] = size;
      item[2] = (long)on_send_complete;
      item[3] = (long)callback_context;
      item[4] = (long)socket_io_instance->pending_io_list;
      memcpy((void *)*item,buffer,size);
      pLVar3 = singlylinkedlist_add(socket_io_instance->pending_io_list,item);
      if (pLVar3 == (LIST_ITEM_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/socketio_berkeley.c"
                    ,"add_pending_io",0xf8,1,"Failure: Unable to add socket to pending list.");
        }
        free((void *)*item);
        free(item);
        pending_socket_io._4_4_ = 0xfb;
      }
      else {
        pending_socket_io._4_4_ = 0;
      }
    }
  }
  return pending_socket_io._4_4_;
}

Assistant:

static int add_pending_io(SOCKET_IO_INSTANCE* socket_io_instance, const unsigned char* buffer, size_t size, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    int result;
    PENDING_SOCKET_IO* pending_socket_io = (PENDING_SOCKET_IO*)malloc(sizeof(PENDING_SOCKET_IO));
    if (pending_socket_io == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        pending_socket_io->bytes = (unsigned char*)malloc(size);
        if (pending_socket_io->bytes == NULL)
        {
            LogError("Allocation Failure: Unable to allocate pending list.");
            free(pending_socket_io);
            result = MU_FAILURE;
        }
        else
        {
            pending_socket_io->size = size;
            pending_socket_io->on_send_complete = on_send_complete;
            pending_socket_io->callback_context = callback_context;
            pending_socket_io->pending_io_list = socket_io_instance->pending_io_list;
            (void)memcpy(pending_socket_io->bytes, buffer, size);

            if (singlylinkedlist_add(socket_io_instance->pending_io_list, pending_socket_io) == NULL)
            {
                LogError("Failure: Unable to add socket to pending list.");
                free(pending_socket_io->bytes);
                free(pending_socket_io);
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
    }
    return result;
}